

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-ws.c
# Opt level: O0

int rops_handle_POLLOUT_ws(lws *wsi)

{
  int iVar1;
  lws_write_protocol local_1c;
  int n;
  int write_type;
  lws *wsi_local;
  
  local_1c = LWS_WRITE_PONG;
  if ((wsi->wsistate & 0xffff) == 0x11b) {
    _lws_log(0x10,"sending close packet\n");
    lwsl_hexdump_level(0x10,wsi->ws->ping_payload_buf + 0x10,
                       (ulong)wsi->ws->close_in_ping_buffer_len);
    *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xfffffffffdffffff;
    iVar1 = lws_write(wsi,wsi->ws->ping_payload_buf + 0x10,(ulong)wsi->ws->close_in_ping_buffer_len,
                      4);
    if (-1 < iVar1) {
      if ((*(ulong *)&wsi->field_0x2dc >> 0x1a & 1) != 0) {
        lwsi_set_state(wsi,0x11d);
        lws_set_timeout(wsi,PENDING_TIMEOUT_CLOSE_ACK,5);
        _lws_log(0x10,"sent close, await ack\n");
        return 0;
      }
      *(ulong *)&wsi->field_0x2dc = *(ulong *)&wsi->field_0x2dc & 0xfffffffffbffffff;
      lwsi_set_state(wsi,0x11c);
    }
    wsi_local._4_4_ = 1;
  }
  else if (((wsi->role_ops == &role_ops_ws) && ((*(ushort *)&wsi->ws->field_0x95 >> 7 & 1) != 0)) ||
          (((wsi->wsistate & 0xffff) == 0x11c && ((*(ushort *)&wsi->ws->field_0x95 >> 6 & 1) != 0)))
          ) {
    if ((*(ushort *)&wsi->ws->field_0x95 >> 6 & 1) == 0) {
      if (wsi->wsistate_pre_close != 0) {
        *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xff7f;
        return 0;
      }
      _lws_log(8,"issuing pong %d on wsi %p\n",(ulong)wsi->ws->ping_payload_len,wsi);
    }
    else {
      local_1c = 4;
    }
    iVar1 = lws_write(wsi,wsi->ws->ping_payload_buf + 0x10,(ulong)wsi->ws->ping_payload_len,local_1c
                     );
    if (iVar1 < 0) {
      wsi_local._4_4_ = 1;
    }
    else {
      *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xff7f;
      if ((*(ushort *)&wsi->ws->field_0x95 >> 6 & 1) == 0) {
        wsi_local._4_4_ = 0;
      }
      else {
        wsi_local._4_4_ = 1;
      }
    }
  }
  else if (((*(ulong *)&wsi->field_0x2dc >> 0xc & 1) == 0) &&
          ((*(ushort *)&wsi->ws->field_0x95 >> 0xd & 1) != 0)) {
    _lws_log(8,"%s: issuing ping on wsi %p: %s %s h2: %d\n","rops_handle_POLLOUT_ws",wsi,
             wsi->role_ops->name,wsi->protocol->name,(uint)(*(ulong *)&wsi->field_0x2dc >> 1) & 1);
    *(ushort *)&wsi->ws->field_0x95 = *(ushort *)&wsi->ws->field_0x95 & 0xdfff;
    iVar1 = lws_write(wsi,wsi->ws->ping_payload_buf + 0x10,0,LWS_WRITE_PING);
    if (iVar1 < 0) {
      wsi_local._4_4_ = 1;
    }
    else {
      wsi_local._4_4_ = 0;
    }
  }
  else if ((wsi->wsistate & 0xffff) == 0x11c) {
    wsi_local._4_4_ = 2;
  }
  else {
    wsi_local._4_4_ = 2;
  }
  return wsi_local._4_4_;
}

Assistant:

int rops_handle_POLLOUT_ws(struct lws *wsi)
{
	int write_type = LWS_WRITE_PONG;
#if !defined(LWS_WITHOUT_EXTENSIONS)
	struct lws_ext_pm_deflate_rx_ebufs pmdrx;
	int ret, m;
#endif
	int n;

#if !defined(LWS_WITHOUT_EXTENSIONS)
	lwsl_debug("%s: %s: wsi->ws->tx_draining_ext %d\n", __func__,
			wsi->protocol->name, wsi->ws->tx_draining_ext);
#endif

	/* Priority 3: pending control packets (pong or close)
	 *
	 * 3a: close notification packet requested from close api
	 */

	if (lwsi_state(wsi) == LRS_WAITING_TO_SEND_CLOSE) {
		lwsl_debug("sending close packet\n");
		lwsl_hexdump_debug(&wsi->ws->ping_payload_buf[LWS_PRE],
				   wsi->ws->close_in_ping_buffer_len);
		wsi->waiting_to_send_close_frame = 0;
		n = lws_write(wsi, &wsi->ws->ping_payload_buf[LWS_PRE],
			      wsi->ws->close_in_ping_buffer_len,
			      LWS_WRITE_CLOSE);
		if (n >= 0) {
			if (wsi->close_needs_ack) {
				lwsi_set_state(wsi, LRS_AWAITING_CLOSE_ACK);
				lws_set_timeout(wsi, PENDING_TIMEOUT_CLOSE_ACK,
						5);
				lwsl_debug("sent close, await ack\n");

				return LWS_HP_RET_BAIL_OK;
			}
			wsi->close_needs_ack = 0;
			lwsi_set_state(wsi, LRS_RETURNED_CLOSE);
		}

		return LWS_HP_RET_BAIL_DIE;
	}

	/* else, the send failed and we should just hang up */

	if ((lwsi_role_ws(wsi) && wsi->ws->ping_pending_flag) ||
	    (lwsi_state(wsi) == LRS_RETURNED_CLOSE &&
	     wsi->ws->payload_is_close)) {

		if (wsi->ws->payload_is_close)
			write_type = LWS_WRITE_CLOSE;
		else {
			if (wsi->wsistate_pre_close) {
				/* we started close flow, forget pong */
				wsi->ws->ping_pending_flag = 0;
				return LWS_HP_RET_BAIL_OK;
			}
			lwsl_info("issuing pong %d on wsi %p\n",
				  wsi->ws->ping_payload_len, wsi);
		}

		n = lws_write(wsi, &wsi->ws->ping_payload_buf[LWS_PRE],
			      wsi->ws->ping_payload_len, write_type);
		if (n < 0)
			return LWS_HP_RET_BAIL_DIE;

		/* well he is sent, mark him done */
		wsi->ws->ping_pending_flag = 0;
		if (wsi->ws->payload_is_close) {
			// assert(0);
			/* oh... a close frame was it... then we are done */
			return LWS_HP_RET_BAIL_DIE;
		}

		/* otherwise for PING, leave POLLOUT active either way */
		return LWS_HP_RET_BAIL_OK;
	}

	if (!wsi->socket_is_permanently_unusable &&
	    wsi->ws->send_check_ping) {

		lwsl_info("%s: issuing ping on wsi %p: %s %s h2: %d\n", __func__, wsi,
				wsi->role_ops->name, wsi->protocol->name,
				wsi->mux_substream);
		wsi->ws->send_check_ping = 0;
		n = lws_write(wsi, &wsi->ws->ping_payload_buf[LWS_PRE],
			      0, LWS_WRITE_PING);
		if (n < 0)
			return LWS_HP_RET_BAIL_DIE;

		return LWS_HP_RET_BAIL_OK;
	}

	/* Priority 4: if we are closing, not allowed to send more data frags
	 *	       which means user callback or tx ext flush banned now
	 */
	if (lwsi_state(wsi) == LRS_RETURNED_CLOSE)
		return LWS_HP_RET_USER_SERVICE;

#if !defined(LWS_WITHOUT_EXTENSIONS)
	/* Priority 5: Tx path extension with more to send
	 *
	 *	       These are handled as new fragments each time around
	 *	       So while we must block new writeable callback to enforce
	 *	       payload ordering, but since they are always complete
	 *	       fragments control packets can interleave OK.
	 */
	if (wsi->ws->tx_draining_ext) {
		lwsl_ext("SERVICING TX EXT DRAINING\n");
		if (lws_write(wsi, NULL, 0, LWS_WRITE_CONTINUATION) < 0)
			return LWS_HP_RET_BAIL_DIE;
		/* leave POLLOUT active */
		return LWS_HP_RET_BAIL_OK;
	}

	/* Priority 6: extensions
	 */
	if (!wsi->ws->extension_data_pending && !wsi->ws->tx_draining_ext) {
		lwsl_ext("%s: !wsi->ws->extension_data_pending\n", __func__);
		return LWS_HP_RET_USER_SERVICE;
	}

	/*
	 * Check in on the active extensions, see if they had pending stuff to
	 * spill... they need to get the first look-in otherwise sequence will
	 * be disordered.
	 *
	 * coming here with a NULL, zero-length ebuf means just spill pending
	 */

	ret = 1;
	if (wsi->role_ops == &role_ops_raw_skt ||
	    wsi->role_ops == &role_ops_raw_file)
		ret = 0;

	while (ret == 1) {

		/* default to nobody has more to spill */

		ret = 0;
		pmdrx.eb_in.token = NULL;
		pmdrx.eb_in.len = 0;

		/* give every extension a chance to spill */

		m = lws_ext_cb_active(wsi, LWS_EXT_CB_PACKET_TX_PRESEND,
				      &pmdrx, 0);
		if (m < 0) {
			lwsl_err("ext reports fatal error\n");
			return LWS_HP_RET_BAIL_DIE;
		}
		if (m)
			/*
			 * at least one extension told us he has more
			 * to spill, so we will go around again after
			 */
			ret = 1;

		/* assuming they gave us something to send, send it */

		if (pmdrx.eb_in.len) {
			n = lws_issue_raw(wsi, (unsigned char *)pmdrx.eb_in.token,
					pmdrx.eb_in.len);
			if (n < 0) {
				lwsl_info("closing from POLLOUT spill\n");
				return LWS_HP_RET_BAIL_DIE;
			}
			/*
			 * Keep amount spilled small to minimize chance of this
			 */
			if (n != pmdrx.eb_in.len) {
				lwsl_err("Unable to spill ext %d vs %d\n",
						pmdrx.eb_in.len, n);
				return LWS_HP_RET_BAIL_DIE;
			}
		} else
			continue;

		/* no extension has more to spill */

		if (!ret)
			continue;

		/*
		 * There's more to spill from an extension, but we just sent
		 * something... did that leave the pipe choked?
		 */

		if (!lws_send_pipe_choked(wsi))
			/* no we could add more */
			continue;

		lwsl_info("choked in POLLOUT service\n");

		/*
		 * Yes, he's choked.  Leave the POLLOUT masked on so we will
		 * come back here when he is unchoked.  Don't call the user
		 * callback to enforce ordering of spilling, he'll get called
		 * when we come back here and there's nothing more to spill.
		 */

		return LWS_HP_RET_BAIL_OK;
	}

	wsi->ws->extension_data_pending = 0;
#endif

	return LWS_HP_RET_USER_SERVICE;
}